

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_utils.c
# Opt level: O3

asterism_str asterism_strstrip(asterism_str s)

{
  ushort **ppuVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  asterism_str aVar10;
  
  sVar3 = s.len;
  pcVar6 = s.p;
  if (sVar3 == 0) {
    sVar5 = 0;
    pcVar2 = pcVar6;
  }
  else {
    ppuVar1 = __ctype_b_loc();
    pcVar2 = pcVar6 + sVar3;
    lVar8 = -sVar3;
    sVar5 = 0;
    pcVar7 = pcVar6;
    do {
      if ((*(byte *)((long)*ppuVar1 + (long)*pcVar7 * 2 + 1) & 0x20) == 0) {
        ppuVar1 = __ctype_b_loc();
        sVar5 = 0;
        lVar4 = 0;
        goto LAB_0010ed56;
      }
      pcVar7 = pcVar7 + 1;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0);
  }
  goto LAB_0010ed7d;
  while (bVar9 = lVar8 + 1 != lVar4, lVar4 = lVar4 + -1, bVar9) {
LAB_0010ed56:
    pcVar2 = pcVar7;
    if ((*(byte *)((long)*ppuVar1 + (long)pcVar6[lVar4 + (sVar3 - 1)] * 2 + 1) & 0x20) == 0) {
      sVar5 = lVar4 - lVar8;
      break;
    }
  }
LAB_0010ed7d:
  aVar10.len = sVar5;
  aVar10.p = pcVar2;
  return aVar10;
}

Assistant:

struct asterism_str asterism_strstrip(struct asterism_str s)
{
    while (s.len > 0 && isspace((int)*s.p))
    {
        s.p++;
        s.len--;
    }
    while (s.len > 0 && isspace((int)*(s.p + s.len - 1)))
    {
        s.len--;
    }
    return s;
}